

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

string * __thiscall
pbrt::FormattingScene::upgradeMaterialIndex
          (FormattingScene *this,string *name,ParameterDictionary *dict,FileLoc loc)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  ParameterDictionary *in_RCX;
  string *in_RDI;
  Float value;
  vector<float,_std::allocator<float>_> index;
  string tex;
  string *in_stack_fffffffffffffd28;
  ParameterDictionary *in_stack_fffffffffffffd30;
  ParameterDictionary *in_stack_fffffffffffffd38;
  SceneRepresentation *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  ParameterDictionary *args;
  FormattingScene *in_stack_fffffffffffffd58;
  FormattingScene *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  allocator<char> *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  ParameterDictionary *this_01;
  ParameterDictionary *in_stack_fffffffffffffd78;
  string local_218 [32];
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [32];
  value_type local_1b0;
  undefined1 local_1aa;
  undefined1 local_1a9 [62];
  allocator<char> local_16b;
  allocator<char> local_16a;
  allocator<char> local_169;
  string local_168 [32];
  vector<float,_std::allocator<float>_> local_148;
  string local_130 [32];
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  undefined4 local_c8;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [32];
  string local_58 [55];
  allocator<char> local_21;
  ParameterDictionary *local_20;
  
  local_20 = in_RCX;
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  if ((bVar1) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28), bVar1))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
               (allocator<char> *)in_stack_fffffffffffffd60);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
               (allocator<char> *)in_stack_fffffffffffffd60);
    ParameterDictionary::GetTexture(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                 (allocator<char> *)in_stack_fffffffffffffd60);
      ParameterDictionary::GetTexture(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                   (allocator<char> *)in_stack_fffffffffffffd60);
        ParameterDictionary::RemoveTexture(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        std::__cxx11::string::~string(local_e8);
        std::allocator<char>::~allocator(&local_e9);
        indent_abi_cxx11_(in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20))
        ;
        StringPrintf<std::__cxx11::string&>
                  ((char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
        std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_110);
        local_c8 = 1;
      }
      else {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  (in_stack_fffffffffffffd40,(FileLoc *)in_stack_fffffffffffffd38,
                   (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                   (allocator<char> *)in_stack_fffffffffffffd60);
        std::allocator<char>::~allocator(&local_c2);
        local_c8 = 1;
      }
    }
    else {
      this_01 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (char *)in_stack_fffffffffffffd68,(allocator<char> *)in_stack_fffffffffffffd60);
      ParameterDictionary::GetFloatArray
                (in_stack_fffffffffffffd38,(string *)in_stack_fffffffffffffd30);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
      bVar1 = std::vector<float,_std::allocator<float>_>::empty
                        ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd40);
      if (bVar1) {
        paVar6 = &local_16a;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   (char *)paVar6,(allocator<char> *)in_stack_fffffffffffffd60);
        std::allocator<char>::~allocator(&local_16a);
      }
      else {
        sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_148);
        if (sVar4 == 1) {
          this_00 = (FormattingScene *)local_1a9;
          args = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                     (char *)in_stack_fffffffffffffd68,(allocator<char> *)in_stack_fffffffffffffd60)
          ;
          ParameterDictionary::GetFloatArray
                    (in_stack_fffffffffffffd38,(string *)in_stack_fffffffffffffd30);
          bVar1 = std::vector<float,_std::allocator<float>_>::empty
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd40);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd40);
          std::__cxx11::string::~string((string *)(local_1a9 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_1a9);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_148,0);
            local_1b0 = *pvVar5;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                       (char *)in_stack_fffffffffffffd68,
                       (allocator<char> *)in_stack_fffffffffffffd60);
            ParameterDictionary::RemoveFloat(local_20,in_stack_fffffffffffffd28);
            std::__cxx11::string::~string(local_1d0);
            std::allocator<char>::~allocator(&local_1d1);
            indent_abi_cxx11_(this_00,(int)((ulong)args >> 0x20));
            StringPrintf<float&>((char *)this_00,(float *)args);
            std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
            std::__cxx11::string::~string(local_218);
            std::__cxx11::string::~string(local_1f8);
          }
          else {
            SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                      (in_stack_fffffffffffffd40,(FileLoc *)in_stack_fffffffffffffd38,
                       (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
            in_stack_fffffffffffffd40 = (SceneRepresentation *)&local_1aa;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                       (char *)in_stack_fffffffffffffd68,
                       (allocator<char> *)in_stack_fffffffffffffd60);
            std::allocator<char>::~allocator((allocator<char> *)&local_1aa);
          }
        }
        else {
          SceneRepresentation::ErrorExitDeferred<>
                    ((SceneRepresentation *)in_stack_fffffffffffffd30,
                     (FileLoc *)in_stack_fffffffffffffd28,(char *)0x9d6d30);
          paVar6 = &local_16b;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                     (char *)in_stack_fffffffffffffd68,paVar6);
          std::allocator<char>::~allocator(&local_16b);
        }
      }
      local_c8 = 1;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd40);
    }
    std::__cxx11::string::~string(local_58);
  }
  return in_RDI;
}

Assistant:

std::string FormattingScene::upgradeMaterialIndex(const std::string &name,
                                                  ParameterDictionary *dict,
                                                  FileLoc loc) const {
    if (name != "glass" && name != "uber")
        return "";

    std::string tex = dict->GetTexture("index");
    if (!tex.empty()) {
        if (!dict->GetTexture("eta").empty()) {
            ErrorExitDeferred(
                &loc, R"(Material "%s" has both "index" and "eta" parameters.)", name);
            return "";
        }

        dict->RemoveTexture("index");
        return indent(1) + StringPrintf("\"texture eta\" \"%s\"\n", tex);
    } else {
        auto index = dict->GetFloatArray("index");
        if (index.empty())
            return "";
        if (index.size() != 1) {
            ErrorExitDeferred(&loc, "Multiple values provided for \"index\" parameter.");
            return "";
        }
        if (!dict->GetFloatArray("eta").empty()) {
            ErrorExitDeferred(
                &loc, R"(Material "%s" has both "index" and "eta" parameters.)", name);
            return "";
        }

        Float value = index[0];
        dict->RemoveFloat("index");
        return indent(1) + StringPrintf("\"float eta\" [ %f ]\n", value);
    }
}